

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall trento::Proton::Proton(Proton *this)

{
  undefined8 *in_RDI;
  size_t in_stack_00000018;
  Nucleus *in_stack_00000020;
  
  Nucleus::Nucleus(in_stack_00000020,in_stack_00000018);
  *in_RDI = &PTR__Proton_0016c9d0;
  return;
}

Assistant:

Proton::Proton() : Nucleus(1) {}